

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setIconSize(ToolBarLayout *this,QSize *s)

{
  bool bVar1;
  QLayoutItem **ppQVar2;
  QObject *object;
  ToolButton *this_00;
  QList<QLayoutItem_*> *in_RDX;
  ToolButton *b;
  QLayoutItem *item;
  undefined1 local_48 [8];
  QForeachContainer<QList<QLayoutItem_*>_> _container_315;
  QSize *s_local;
  ToolBarLayout *this_local;
  
  _container_315._40_8_ = s;
  QtPrivate::qMakeForeachContainer<QList<QLayoutItem*>&>
            ((QForeachContainer<QList<QLayoutItem_*>_> *)local_48,(QtPrivate *)&this->buttons,in_RDX
            );
  while( true ) {
    bVar1 = QList<QLayoutItem_*>::const_iterator::operator!=
                      ((const_iterator *)&_container_315.c.d.size,_container_315.i);
    if (!bVar1) break;
    ppQVar2 = QList<QLayoutItem_*>::const_iterator::operator*
                        ((const_iterator *)&_container_315.c.d.size);
    object = (QObject *)(**(code **)(*(long *)*ppQVar2 + 0x68))();
    this_00 = qobject_cast<QtMWidgets::ToolButton*>(object);
    if (this_00 != (ToolButton *)0x0) {
      ToolButton::setIconSize(this_00,(QSize *)_container_315._40_8_);
    }
    QList<QLayoutItem_*>::const_iterator::operator++((const_iterator *)&_container_315.c.d.size);
  }
  QtPrivate::QForeachContainer<QList<QLayoutItem_*>_>::~QForeachContainer
            ((QForeachContainer<QList<QLayoutItem_*>_> *)local_48);
  QLayout::update();
  return;
}

Assistant:

void
ToolBarLayout::setIconSize( const QSize & s )
{
	foreach( QLayoutItem * item, buttons )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( item->widget() );

		if( b )
			b->setIconSize( s );
	}

	update();
}